

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QNetworkAddressEntry *entry)

{
  _Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false> _Var1;
  bool bVar2;
  long *plVar3;
  QDebug *pQVar4;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QHostAddress local_78;
  undefined1 local_70 [8];
  QHostAddress local_68;
  undefined1 local_60 [8];
  QNetworkAddressEntry local_58;
  QHostAddress local_50;
  undefined1 local_48 [8];
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_40,(QDebug *)entry);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)entry,"address = ");
  local_50.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)pQVar4->stream;
  *(int *)((long)local_50.d.d.ptr + 0x28) = *(int *)((long)local_50.d.d.ptr + 0x28) + 1;
  QNetworkAddressEntry::ip(&local_58);
  operator<<((Stream *)local_48,&local_50);
  QDebug::~QDebug((QDebug *)local_48);
  QHostAddress::~QHostAddress((QHostAddress *)&local_58);
  QDebug::~QDebug((QDebug *)&local_50);
  QNetworkAddressEntry::netmask(&local_58);
  bVar2 = QHostAddress::isNull((QHostAddress *)&local_58);
  QHostAddress::~QHostAddress((QHostAddress *)&local_58);
  if (!bVar2) {
    pQVar4 = QDebug::operator<<((QDebug *)entry,", netmask = ");
    local_68.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)pQVar4->stream;
    *(int *)((long)local_68.d.d.ptr + 0x28) = *(int *)((long)local_68.d.d.ptr + 0x28) + 1;
    QNetworkAddressEntry::netmask(&local_58);
    operator<<((Stream *)local_60,&local_68);
    QDebug::~QDebug((QDebug *)local_60);
    QHostAddress::~QHostAddress((QHostAddress *)&local_58);
    QDebug::~QDebug((QDebug *)&local_68);
  }
  QNetworkAddressEntry::broadcast(&local_58);
  bVar2 = QHostAddress::isNull((QHostAddress *)&local_58);
  QHostAddress::~QHostAddress((QHostAddress *)&local_58);
  if (!bVar2) {
    pQVar4 = QDebug::operator<<((QDebug *)entry,", broadcast = ");
    local_78.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)pQVar4->stream;
    *(int *)((long)local_78.d.d.ptr + 0x28) = *(int *)((long)local_78.d.d.ptr + 0x28) + 1;
    QNetworkAddressEntry::broadcast(&local_58);
    operator<<((Stream *)local_70,&local_78);
    QDebug::~QDebug((QDebug *)local_70);
    QHostAddress::~QHostAddress((QHostAddress *)&local_58);
    QDebug::~QDebug((QDebug *)&local_78);
  }
  _Var1._M_head_impl =
       (entry->d)._M_t.
       super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
       .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl;
  (entry->d)._M_t.
  super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
  .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl =
       (QNetworkAddressEntryPrivate *)0x0;
  *(QNetworkAddressEntryPrivate **)debug.stream = _Var1._M_head_impl;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QNetworkAddressEntry &entry)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "address = " << entry.ip();
    if (!entry.netmask().isNull())
        debug << ", netmask = " << entry.netmask();
    if (!entry.broadcast().isNull())
        debug << ", broadcast = " << entry.broadcast();
    return debug;
}